

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchiveXML.h
# Opt level: O2

void __thiscall
chrono::ChArchiveInXML::ChArchiveInXML(ChArchiveInXML *this,ChStreamInAsciiFile *mistream)

{
  xml_document<char> *this_00;
  vector<char,_std::allocator<char>_> *this_01;
  ChExceptionArchive *this_02;
  string line;
  string local_d0 [5];
  
  ChArchiveIn::ChArchiveIn(&this->super_ChArchiveIn);
  this_00 = &this->document;
  (this->super_ChArchiveIn).super_ChArchive._vptr_ChArchive =
       (_func_int **)&PTR__ChArchiveInXML_00161578;
  rapidxml::xml_document<char>::xml_document(this_00);
  std::
  stack<rapidxml::xml_node<char>*,std::deque<rapidxml::xml_node<char>*,std::allocator<rapidxml::xml_node<char>*>>>
  ::stack<std::deque<rapidxml::xml_node<char>*,std::allocator<rapidxml::xml_node<char>*>>,void>
            (&this->levels);
  std::stack<bool,std::deque<bool,std::allocator<bool>>>::
  stack<std::deque<bool,std::allocator<bool>>,void>(&this->is_array);
  std::stack<int,std::deque<int,std::allocator<int>>>::
  stack<std::deque<int,std::allocator<int>>,void>(&this->array_index);
  (this->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this_01 = &this->buffer;
  (this->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  this->istream = mistream;
  std::vector<char,std::allocator<char>>::
  _M_assign_aux<std::istreambuf_iterator<char,std::char_traits<char>>>
            ((vector<char,std::allocator<char>> *)this_01,
             *(undefined8 *)(mistream + *(long *)(*(long *)(mistream + 8) + -0x18) + 0xf0),
             0xffffffffffffffff,0,0xffffffff);
  line._M_dataplus._M_p._0_1_ = 0;
  std::vector<char,_std::allocator<char>_>::emplace_back<char>(this_01,(char *)&line);
  rapidxml::xml_document<char>::parse<0>
            (this_00,(this_01->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                     super__Vector_impl_data._M_start);
  if ((this->document).super_xml_node<char>.m_first_node != (xml_node<char> *)0x0) {
    this->level = &this_00->super_xml_node<char>;
    std::deque<rapidxml::xml_node<char>_*,_std::allocator<rapidxml::xml_node<char>_*>_>::push_back
              (&(this->levels).c,&this->level);
    line._M_dataplus._M_p._0_1_ = 0;
    std::deque<bool,_std::allocator<bool>_>::emplace_back<bool>(&(this->is_array).c,(bool *)&line);
    this->tolerate_missing_tokens = false;
    return;
  }
  this_02 = (ChExceptionArchive *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string
            ((string *)local_d0,"The file is not a valid XML document",(allocator *)&line);
  ChExceptionArchive::ChExceptionArchive(this_02,local_d0);
  __cxa_throw(this_02,&ChExceptionArchive::typeinfo,ChException::~ChException);
}

Assistant:

ChArchiveInXML( ChStreamInAsciiFile& mistream) {
            istream = &mistream;

			buffer.assign((std::istreambuf_iterator<char>(istream->GetFstream())), std::istreambuf_iterator<char>());
			buffer.push_back('\0');

			try {
				document.parse<0>(&buffer[0]);
			}
			catch (const rapidxml::parse_error &merror) {
				std::string line(merror.where<char>());
				line.erase(std::find_if(line.begin(), line.end(), [](int c) {return (c==*"\n");}), line.end());
				throw ChExceptionArchive(std::string("XML parsing error: ") + merror.what() + " at: \n" + line + "\n");
			}

			if (!document.first_node())
				throw (ChExceptionArchive("The file is not a valid XML document"));

			level = &document;//.first_node();
            levels.push(level);
            is_array.push(false);

            tolerate_missing_tokens = false;
      }